

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O0

Error * ot::commissioner::ReadHexStringFile
                  (Error *__return_storage_ptr__,ByteArray *aData,string *aFilename)

{
  bool bVar1;
  Error *pEVar2;
  ErrorCode local_104;
  Error local_100;
  undefined8 local_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  undefined8 local_c8 [2];
  undefined8 local_b8;
  undefined8 local_b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  undefined8 local_a0;
  ErrorCode local_98 [4];
  Error local_88;
  undefined1 local_60 [8];
  ByteArray data;
  string hexString;
  string *aFilename_local;
  ByteArray *aData_local;
  Error *error;
  
  Error::Error(__return_storage_ptr__);
  std::__cxx11::string::string
            ((string *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  ReadFile(&local_88,
           (string *)
           &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage,aFilename);
  pEVar2 = Error::operator=(__return_storage_ptr__,&local_88);
  local_98[0] = kNone;
  bVar1 = operator!=(pEVar2,local_98);
  Error::~Error(&local_88);
  if (!bVar1) {
    local_b0 = std::__cxx11::string::begin();
    local_b8 = std::__cxx11::string::end();
    local_a8 = std::
               remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::__0>
                         (local_b0,local_b8);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_a0,&local_a8);
    local_d0._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)local_c8,&local_d0);
    local_d8 = std::__cxx11::string::erase
                         (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,local_a0,local_c8[0]);
    utils::Hex(&local_100,(ByteArray *)local_60,
               (string *)
               &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pEVar2 = Error::operator=(__return_storage_ptr__,&local_100);
    local_104 = kNone;
    bVar1 = operator!=(pEVar2,&local_104);
    Error::~Error(&local_100);
    if (!bVar1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (aData,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  std::__cxx11::string::~string
            ((string *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

Error ReadHexStringFile(ByteArray &aData, const std::string &aFilename)
{
    Error       error;
    std::string hexString;
    ByteArray   data;

    SuccessOrExit(error = ReadFile(hexString, aFilename));

    hexString.erase(std::remove_if(hexString.begin(), hexString.end(), [](int c) { return isspace(c); }),
                    hexString.end());
    SuccessOrExit(error = utils::Hex(data, hexString));

    aData = data;

exit:
    return error;
}